

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCases.cpp
# Opt level: O0

void Test36(void)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this;
  CMReturn In;
  CMOptions Options;
  undefined1 auVar1 [24];
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_22b8;
  allocator<unsigned_long> local_2291;
  unsigned_long local_2290 [2];
  iterator local_2280;
  size_type local_2278;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_2270;
  allocator<unsigned_long> local_2251;
  unsigned_long local_2250 [2];
  iterator local_2240;
  size_type local_2238;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_2230;
  uint64_t local_2218;
  uint64_t uStack_2210;
  uint64_t local_2208;
  pointer local_21f8;
  undefined8 uStack_21f0;
  undefined8 local_21e8;
  undefined8 uStack_21e0;
  undefined8 local_21d8;
  undefined8 uStack_21d0;
  allocator<char> local_21b9;
  string local_21b8;
  allocator<char> local_2191;
  string local_2190;
  undefined1 auStack_2170 [8];
  CMReturn res;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2148;
  iterator local_2128;
  size_type local_2120;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2118;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_20e0;
  undefined1 local_20c8 [8];
  ConfusableMatcher matcher;
  CMOptions opts;
  char *local_80;
  char *local_78;
  pair<const_char_*,_const_char_*> local_70;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  undefined1 local_20 [8];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  map;
  
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_20);
  local_78 = " ";
  local_80 = " ";
  std::pair<const_char_*,_const_char_*>::pair<const_char_*,_const_char_*,_true>
            (&local_70,&local_78,&local_80);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_*,_const_char_*,_true>(&local_60,&local_70);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_20,&local_60);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_60);
  matcher.TheMap[0xff].
  super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_20e0,
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_20);
  res._22_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2148," ",(allocator<char> *)&res.field_0x17);
  res._22_1_ = 0;
  local_2128 = &local_2148;
  local_2120 = 1;
  this = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)((long)&res.Status + 3);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(this);
  __l_01._M_len = local_2120;
  __l_01._M_array = local_2128;
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set(&local_2118,__l_01,0,(hasher *)&res.field_0x15,(key_equal *)&res.field_0x14,this);
  ConfusableMatcher::ConfusableMatcher((ConfusableMatcher *)local_20c8,&local_20e0,&local_2118,true)
  ;
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unordered_set(&local_2118);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&res.Status + 3));
  local_22b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2128;
  do {
    local_22b8 = local_22b8 + -1;
    std::__cxx11::string::~string((string *)local_22b8);
  } while (local_22b8 != &local_2148);
  std::allocator<char>::~allocator((allocator<char> *)&res.field_0x17);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_20e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2190,"a Q Q Q f",&local_2191);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_21b8,"Q Q",&local_21b9);
  local_21d8 = 1;
  uStack_21d0 = 0;
  local_21e8 = 0;
  uStack_21e0 = 1000000;
  local_21f8 = matcher.TheMap[0xff].
               super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  uStack_21f0 = 0;
  auVar1 = ZEXT824(matcher.TheMap[0xff].
                   super__Vector_base<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Options.TimeoutNs = 1000000;
  Options.MatchRepeating = (bool)auVar1[0];
  Options._1_7_ = auVar1._1_7_;
  Options.StartIndex = auVar1._8_8_;
  Options.StartFromEnd = (bool)auVar1[0x10];
  Options._17_7_ = auVar1._17_7_;
  Options._32_8_ = 1;
  Options.ContainsPosPointers = (void *)0x0;
  ConfusableMatcher::IndexOf
            ((CMReturn *)auStack_2170,(ConfusableMatcher *)local_20c8,&local_2190,&local_21b8,
             Options);
  std::__cxx11::string::~string((string *)&local_21b8);
  std::allocator<char>::~allocator(&local_21b9);
  std::__cxx11::string::~string((string *)&local_2190);
  std::allocator<char>::~allocator(&local_2191);
  local_2208 = res.Size;
  local_2218 = (uint64_t)auStack_2170;
  uStack_2210 = res.Start;
  local_2250[0] = 2;
  local_2250[1] = 4;
  local_2240 = local_2250;
  local_2238 = 2;
  std::allocator<unsigned_long>::allocator(&local_2251);
  __l_00._M_len = local_2238;
  __l_00._M_array = local_2240;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_2230,__l_00,&local_2251)
  ;
  local_2290[0] = 3;
  local_2290[1] = 3;
  local_2280 = local_2290;
  local_2278 = 2;
  std::allocator<unsigned_long>::allocator(&local_2291);
  __l._M_len = local_2278;
  __l._M_array = local_2280;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_2270,__l,&local_2291);
  In.Size = uStack_2210;
  In.Start = local_2218;
  In._16_8_ = local_2208;
  AssertMatchMulti(In,&local_2230,&local_2270,MATCH);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_2270);
  std::allocator<unsigned_long>::~allocator(&local_2291);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_2230);
  std::allocator<unsigned_long>::~allocator(&local_2251);
  ConfusableMatcher::~ConfusableMatcher((ConfusableMatcher *)local_20c8);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_20);
  return;
}

Assistant:

void Test36()
{
	std::vector<std::pair<std::string, std::string>> map;
	map.push_back(std::pair(" ", " "));

	CMOptions opts = { };
	opts.TimeoutNs = 1000000;
	opts.MatchOnWordBoundary = true;

	auto matcher = ConfusableMatcher(map, { " " });
	auto res = matcher.IndexOf("a Q Q Q f", "Q Q", opts);
	AssertMatchMulti(res, { 2, 4 }, { 3, 3 });
}